

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O3

maybe<pstore::uint128,_void> *
pstore::uint128::from_hex_string(maybe<pstore::uint128,_void> *__return_storage_ptr__,string *str)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  maybe<unsigned_long,_void> local_40;
  maybe<unsigned_long,_void> local_30;
  
  if ((str->_M_string_length == 0x20) &&
     (anon_unknown.dwarf_93c97f::get64(&local_40,str,0), local_40.valid_ == true)) {
    puVar3 = maybe<unsigned_long,_void>::operator->(&local_40);
    uVar1 = *puVar3;
    anon_unknown.dwarf_93c97f::get64(&local_30,str,0x10);
    if (local_30.valid_ != true) {
      *(undefined8 *)&__return_storage_ptr__->storage_ = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
      *(undefined8 *)__return_storage_ptr__ = 0;
      *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0;
    }
    else {
      puVar3 = maybe<unsigned_long,_void>::operator->(&local_30);
      uVar2 = *puVar3;
      *(unsigned_long *)((long)&__return_storage_ptr__->storage_ + 8) = uVar1;
      *(unsigned_long *)&__return_storage_ptr__->storage_ = uVar2;
    }
    __return_storage_ptr__->valid_ = local_30.valid_ == true;
    return __return_storage_ptr__;
  }
  *(undefined8 *)&__return_storage_ptr__->storage_ = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = 0;
  return __return_storage_ptr__;
}

Assistant:

maybe<uint128> uint128::from_hex_string (std::string const & str) {
        if (str.length () != 32) {
            return nothing<uint128> ();
        }
        return get64 (str, 0U) >>= [&] (std::uint64_t const high) {
            return get64 (str, 16U) >>= [&] (std::uint64_t const low) {
                return just (uint128{high, low});
            };
        };
    }